

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_TypeofPropertyScoped
              (FrameDisplay *pScope,PropertyId propertyId,Var defaultInstance,
              ScriptContext *scriptContext)

{
  ushort uVar1;
  BOOL BVar2;
  RecyclableObject *instance;
  Var pvVar3;
  bool isRoot;
  uint index;
  
  uVar1 = pScope->length;
  if (uVar1 != 0) {
    index = 0;
    do {
      instance = (RecyclableObject *)FrameDisplay::GetItem(pScope,index);
      BVar2 = HasProperty(instance,propertyId);
      if (BVar2 != 0) {
        isRoot = false;
        goto LAB_00aac537;
      }
      index = index + 1;
    } while (uVar1 != index);
  }
  instance = VarTo<Js::RecyclableObject>(defaultInstance);
  isRoot = true;
LAB_00aac537:
  pvVar3 = TypeofFld_Internal(instance,isRoot,propertyId,scriptContext);
  return pvVar3;
}

Assistant:

Var JavascriptOperators::OP_TypeofPropertyScoped(FrameDisplay *pScope, PropertyId propertyId, Var defaultInstance, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_TypeofPropertyScoped);
        int i;
        int length = pScope->GetLength();

        for (i = 0; i < length; i++)
        {
            DynamicObject *obj = (DynamicObject*)pScope->GetItem(i);
            if (JavascriptOperators::HasProperty(obj, propertyId))
            {
                return JavascriptOperators::TypeofFld(obj, propertyId, scriptContext);
            }
        }

        return JavascriptOperators::TypeofRootFld(VarTo<RecyclableObject>(defaultInstance), propertyId, scriptContext);
        JIT_HELPER_END(Op_TypeofPropertyScoped);
    }